

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

void __thiscall
graphics101::TextureCube::TextureCube
          (TextureCube *this,string *image_path_x_plus,string *image_path_x_minus,
          string *image_path_y_plus,string *image_path_y_minus,string *image_path_z_plus,
          string *image_path_z_minus)

{
  pointer pcVar1;
  
  Texture::Texture(&this->super_Texture);
  (this->super_Texture)._vptr_Texture = (_func_int **)&PTR__TextureCube_0019d180;
  (this->m_image_path_x_plus)._M_dataplus._M_p = (pointer)&(this->m_image_path_x_plus).field_2;
  pcVar1 = (image_path_x_plus->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_image_path_x_plus,pcVar1,
             pcVar1 + image_path_x_plus->_M_string_length);
  (this->m_image_path_x_minus)._M_dataplus._M_p = (pointer)&(this->m_image_path_x_minus).field_2;
  pcVar1 = (image_path_x_minus->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_image_path_x_minus,pcVar1,
             pcVar1 + image_path_x_minus->_M_string_length);
  (this->m_image_path_y_plus)._M_dataplus._M_p = (pointer)&(this->m_image_path_y_plus).field_2;
  pcVar1 = (image_path_y_plus->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_image_path_y_plus,pcVar1,
             pcVar1 + image_path_y_plus->_M_string_length);
  (this->m_image_path_y_minus)._M_dataplus._M_p = (pointer)&(this->m_image_path_y_minus).field_2;
  pcVar1 = (image_path_y_minus->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_image_path_y_minus,pcVar1,
             pcVar1 + image_path_y_minus->_M_string_length);
  (this->m_image_path_z_plus)._M_dataplus._M_p = (pointer)&(this->m_image_path_z_plus).field_2;
  pcVar1 = (image_path_z_plus->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_image_path_z_plus,pcVar1,
             pcVar1 + image_path_z_plus->_M_string_length);
  (this->m_image_path_z_minus)._M_dataplus._M_p = (pointer)&(this->m_image_path_z_minus).field_2;
  pcVar1 = (image_path_z_minus->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_image_path_z_minus,pcVar1,
             pcVar1 + image_path_z_minus->_M_string_length);
  (*(this->super_Texture)._vptr_Texture[3])(this);
  return;
}

Assistant:

TextureCube::TextureCube(
    const std::string& image_path_x_plus, const std::string& image_path_x_minus,
    const std::string& image_path_y_plus, const std::string& image_path_y_minus,
    const std::string& image_path_z_plus, const std::string& image_path_z_minus
    )
    : m_image_path_x_plus( image_path_x_plus ), m_image_path_x_minus( image_path_x_minus ),
    m_image_path_y_plus( image_path_y_plus ), m_image_path_y_minus( image_path_y_minus ),
    m_image_path_z_plus( image_path_z_plus ), m_image_path_z_minus( image_path_z_minus )
{
    reload();
}